

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdEmuEmuD3D0Config::emulate_mthd(MthdEmuEmuD3D0Config *this)

{
  uint uVar1;
  int iVar2;
  int local_48;
  int local_44;
  int i_1;
  int i;
  int dblend;
  int sblend;
  int scull;
  int srcmode;
  uint32_t rc_final_b;
  uint32_t rc_in_alpha_b;
  uint32_t rc_in_alpha_a;
  int wrapv;
  int wrapu;
  int sinterp;
  int origin;
  int filt;
  MthdEmuEmuD3D0Config *this_local;
  
  pgraph_celsius_pre_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  sinterp = 1;
  uVar1 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3c) >> 0x3c);
  wrapu = (int)(uVar1 == 0);
  if (uVar1 == 2) {
    sinterp = 2;
  }
  rc_in_alpha_a =
       (uint32_t)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x3a) >> 0x3e);
  if (rc_in_alpha_a == 0) {
    rc_in_alpha_a = 9;
  }
  rc_in_alpha_b =
       (uint32_t)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x38) >> 0x3e);
  if (rc_in_alpha_b == 0) {
    rc_in_alpha_b = 9;
  }
  rc_final_b = 0x18;
  srcmode = 0x14;
  if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x37)) {
    srcmode = 0x20;
  }
  scull = 0x1c80;
  uVar1 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x34) >> 0x3e);
  if (uVar1 == 1) {
    scull = 0x3ca0;
  }
  if (uVar1 == 2) {
    scull = scull | 0x2000;
  }
  if (uVar1 == 3) {
    rc_final_b = 0x20;
    srcmode = 0x20;
  }
  uVar1 = (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x32) >> 0x3e);
  i = 4;
  i_1 = 5;
  if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x22) < 0) {
    i_1 = 9;
    i = 8;
  }
  if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x23) < 0) {
    i_1 = 1;
    i = 1;
  }
  if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x21) < 0) {
    i_1 = 0;
  }
  if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x20) < 0) {
    i = 0;
  }
  if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource <<
                 0x3e)) {
    for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[local_44] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format
           [local_44] & 0xffffffef | wrapu << 4;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[local_44] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format
           [local_44] & 0xf0ffffff | rc_in_alpha_a << 0x18;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[local_44] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format
           [local_44] & 0xfffffff | rc_in_alpha_b << 0x1c;
      pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                          local_44 + 4,
                          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                          bundle_tex_format[local_44],false);
    }
    for (local_48 = 0; local_48 < 2; local_48 = local_48 + 1) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter[local_48] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter
           [local_48] & 0xf8ffffff | sinterp << 0x18;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter[local_48] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter
           [local_48] & 0x8fffffff | sinterp << 0x1c;
      pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                          local_48 + 0xe,
                          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                          bundle_tex_filter[local_48],false);
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_in_alpha[0] =
         rc_final_b << 0x18 | srcmode << 0x10;
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x10,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_rc_in_alpha[0],false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_in_color[0] =
         0x8040000;
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x12,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_rc_in_color[0],false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_factor_0[0] =
         (this->super_SingleMthdTest).super_MthdTest.val;
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x14,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_rc_factor_0[0],false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_factor_1[0] =
         (this->super_SingleMthdTest).super_MthdTest.val;
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x15,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_rc_factor_1[0],false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_out_alpha[0] = 0xc00;
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x16,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_rc_out_alpha[0],false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_out_color[0] = 0xc00;
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x18,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_rc_out_color[0],false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_out_color[1] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_out_color[1] &
         0xc7ffffff | 0x10000000;
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x19,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_rc_out_color[1],false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_final_a = 0xc;
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x1a,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_rc_final_a,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_rc_final_b = scull;
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x1b,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_rc_final_b,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a &
         0xffffbfff |
         (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x29) >> 0x3d != 0) <<
         0xe;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a &
         0xfff0ffff |
         (uint)(((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2c) >> 0x3c) - 1 &
                0xf) << 0x10);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a &
         0xffbfffff | 0x400000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a &
         0xff7fffff |
         (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x30) >> 0x3f) << 0x17);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a &
         0xfeffffff |
         (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x29) >> 0x3d != 0) <<
         0x18;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a &
         0xfdffffff;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a &
         0xfbffffff;
    iVar2 = 0;
    if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x25) >> 0x3d != 0) {
      iVar2 = 7;
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_a &
         0xc7ffffff | iVar2 << 0x1b;
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x1c,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_config_a,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_a = 0x70;
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x1d,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_stencil_a,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_b = 0x222;
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x1e,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_stencil_b,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b &
         0xfffffe00 | 0x1c0;
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x1f,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_config_b,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_blend =
         i << 4 | 10U | i_1 << 8;
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x20,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_blend
                        ,false);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster & 0xffe00000;
    iVar2 = 2;
    if (uVar1 == 3) {
      iVar2 = 1;
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster & 0xff9fffff
         | iVar2 << 0x15;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster & 0xf07fffff
         | 0x4000000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster & 0xcfffffff
         | (uint)(uVar1 != 1) << 0x1c;
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x22,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_raster,true);
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[2] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[3] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b;
  }
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xfffdffff |
       0x20000;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xfeffffff |
       0x1000000;
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		int filt = 1;
		int origin = 0;
		int sinterp = extr(val, 0, 4);
		if (sinterp == 0)
			origin = 1;
		if (sinterp == 2)
			filt = 2;
		int wrapu = extr(val, 4, 2);
		if (wrapu == 0)
			wrapu = 9;
		int wrapv = extr(val, 6, 2);
		if (wrapv == 0)
			wrapv = 9;
		uint32_t rc_in_alpha_a = 0x18;;
		uint32_t rc_in_alpha_b = 0x14;;
		if (!extr(val, 8, 1))
			rc_in_alpha_b = 0x20;
		uint32_t rc_final_b = 0x1c80;
		int srcmode = extr(val, 10, 2);
		if (srcmode == 1)
			rc_final_b |= 0x2020;
		if (srcmode == 2)
			rc_final_b |= 0x2000;
		if (srcmode == 3) {
			rc_in_alpha_a = 0x20;
			rc_in_alpha_b = 0x20;
		}
		int scull = extr(val, 12, 2);
		int sblend = 4, dblend = 5;
		if (extr(val, 29, 1)) {
			dblend = 9;
			sblend = 8;
		}
		if (extr(val, 28, 1))
			sblend = dblend = 1;
		if (extr(val, 30, 1))
			dblend = 0;
		if (extr(val, 31, 1))
			sblend = 0;
		if (!extr(exp.nsource, 1, 1)) {
			for (int i = 0; i < 2; i++) {
				insrt(exp.bundle_tex_format[i], 4, 1, origin);
				insrt(exp.bundle_tex_format[i], 24, 4, wrapu);
				insrt(exp.bundle_tex_format[i], 28, 4, wrapv);
				pgraph_celsius_icmd(&exp, 4 + i, exp.bundle_tex_format[i], false);
			}
			for (int i = 0; i < 2; i++) {
				insrt(exp.bundle_tex_filter[i], 24, 3, filt);
				insrt(exp.bundle_tex_filter[i], 28, 3, filt);
				pgraph_celsius_icmd(&exp, 0xe + i, exp.bundle_tex_filter[i], false);
			}
			exp.bundle_rc_in_alpha[0] = rc_in_alpha_a << 24 | rc_in_alpha_b << 16;
			pgraph_celsius_icmd(&exp, 0x10, exp.bundle_rc_in_alpha[0], false);
			exp.bundle_rc_in_color[0] = 0x08040000;
			pgraph_celsius_icmd(&exp, 0x12, exp.bundle_rc_in_color[0], false);
			exp.bundle_rc_factor_0[0] = val;
			pgraph_celsius_icmd(&exp, 0x14, exp.bundle_rc_factor_0[0], false);
			exp.bundle_rc_factor_1[0] = val;
			pgraph_celsius_icmd(&exp, 0x15, exp.bundle_rc_factor_1[0], false);
			exp.bundle_rc_out_alpha[0] = 0xc00;
			pgraph_celsius_icmd(&exp, 0x16, exp.bundle_rc_out_alpha[0], false);
			exp.bundle_rc_out_color[0] = 0xc00;
			pgraph_celsius_icmd(&exp, 0x18, exp.bundle_rc_out_color[0], false);
			insrt(exp.bundle_rc_out_color[1], 27, 3, 2);
			pgraph_celsius_icmd(&exp, 0x19, exp.bundle_rc_out_color[1], false);
			exp.bundle_rc_final_a = 0xc;
			pgraph_celsius_icmd(&exp, 0x1a, exp.bundle_rc_final_a, false);
			exp.bundle_rc_final_b = rc_final_b;
			pgraph_celsius_icmd(&exp, 0x1b, exp.bundle_rc_final_b, false);
			insrt(exp.bundle_config_a, 14, 1, !!extr(val, 20, 3));
			insrt(exp.bundle_config_a, 16, 4, extr(val, 16, 4) - 1);
			insrt(exp.bundle_config_a, 22, 1, 1);
			insrt(exp.bundle_config_a, 23, 1, extr(val, 15, 1));
			insrt(exp.bundle_config_a, 24, 1, !!extr(val, 20, 3));
			insrt(exp.bundle_config_a, 25, 1, 0);
			insrt(exp.bundle_config_a, 26, 1, 0);
			insrt(exp.bundle_config_a, 27, 3, extr(val, 24, 3) ? 0x7 : 0);
			pgraph_celsius_icmd(&exp, 0x1c, exp.bundle_config_a, false);
			exp.bundle_stencil_a = 0x70;
			pgraph_celsius_icmd(&exp, 0x1d, exp.bundle_stencil_a, false);
			exp.bundle_stencil_b = 0x222;
			pgraph_celsius_icmd(&exp, 0x1e, exp.bundle_stencil_b, false);
			insrt(exp.bundle_config_b, 0, 9, 0x1c0);
			pgraph_celsius_icmd(&exp, 0x1f, exp.bundle_config_b, false);
			exp.bundle_blend = 0xa | sblend << 4 | dblend << 8;
			pgraph_celsius_icmd(&exp, 0x20, exp.bundle_blend, false);
			insrt(exp.bundle_raster, 0, 21, 0);
			insrt(exp.bundle_raster, 21, 2, scull == 3 ? 1 : 2);
			insrt(exp.bundle_raster, 23, 5, 8);
			insrt(exp.bundle_raster, 28, 2, scull != 1);
			pgraph_celsius_icmd(&exp, 0x22, exp.bundle_raster, true);
			exp.celsius_pipe_junk[2] = exp.celsius_xf_misc_a;
			exp.celsius_pipe_junk[3] = exp.celsius_xf_misc_b;
		}
		insrt(exp.valid[1], 17, 1, 1);
		insrt(exp.valid[1], 24, 1, 1);
	}